

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeboneProcess.cpp
# Opt level: O3

void __thiscall
Assimp::DeboneProcess::SplitMesh
          (DeboneProcess *this,aiMesh *pMesh,
          vector<std::pair<aiMesh_*,_const_aiBone_*>,_std::allocator<std::pair<aiMesh_*,_const_aiBone_*>_>_>
          *poNewMeshes)

{
  int *piVar1;
  float fVar2;
  int iVar3;
  iterator iVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  Logger *this_00;
  aiBone **ppaVar8;
  aiMesh *mesh;
  uint uVar9;
  ulong uVar10;
  undefined4 uVar11;
  int iVar12;
  aiBone *paVar13;
  uint uVar14;
  ulong uVar15;
  aiFace *paVar16;
  ulong uVar17;
  aiMesh *this_01;
  uint uVar18;
  ulong uVar19;
  pair<aiMesh_*,_const_aiBone_*> push_pair;
  vector<unsigned_int,_std::allocator<unsigned_int>_> subFaces;
  vector<unsigned_int,_std::allocator<unsigned_int>_> faceBones;
  vector<unsigned_int,_std::allocator<unsigned_int>_> facesPerBone;
  vector<unsigned_int,_std::allocator<unsigned_int>_> vertexBones;
  pair<aiMesh_*,_const_aiBone_*> local_e8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_d8;
  float local_b4;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b0;
  vector<std::pair<aiMesh*,aiBone_const*>,std::allocator<std::pair<aiMesh*,aiBone_const*>>>
  *local_98;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_90;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_78;
  ulong local_60;
  vector<bool,_std::allocator<bool>_> local_58;
  
  local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_1_ = 0;
  local_98 = (vector<std::pair<aiMesh*,aiBone_const*>,std::allocator<std::pair<aiMesh*,aiBone_const*>>>
              *)poNewMeshes;
  std::vector<bool,_std::allocator<bool>_>::vector
            (&local_58,(ulong)pMesh->mNumBones,(bool *)&local_78,(allocator_type *)&local_b0);
  local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0xffffffff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_78,(ulong)pMesh->mNumVertices,(value_type_conflict3 *)&local_b0,
             (allocator_type *)&local_90);
  uVar6 = pMesh->mNumBones;
  if (uVar6 != 0) {
    ppaVar8 = pMesh->mBones;
    uVar19 = 0;
    do {
      paVar13 = ppaVar8[uVar19];
      if (paVar13->mNumWeights != 0) {
        uVar15 = 1L << ((byte)uVar19 & 0x3f);
        bVar5 = (byte)uVar19 & 0x3f;
        local_60 = -2L << bVar5 | 0xfffffffffffffffeU >> 0x40 - bVar5;
        uVar17 = 0;
        do {
          fVar2 = paVar13->mWeights[uVar17].mWeight;
          if ((fVar2 != 0.0) || (NAN(fVar2))) {
            local_b4 = fVar2;
            if (this->mThreshold <= fVar2) {
              uVar7 = (ulong)paVar13->mWeights[uVar17].mVertexId;
              uVar10 = (ulong)*(uint *)(CONCAT71(local_78.
                                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                                 local_78.
                                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                 ._M_impl.super__Vector_impl_data._M_start._0_1_) +
                                       uVar7 * 4);
              uVar11 = (undefined4)uVar19;
              if ((uVar10 == 0xffffffff) || (uVar11 = 0xfffffffe, uVar19 != uVar10)) {
                *(undefined4 *)
                 (CONCAT71(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start._1_7_,
                           local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start._0_1_) + uVar7 * 4) = uVar11;
              }
              else {
                this_00 = DefaultLogger::get();
                Logger::warn(this_00,"Encountered double entry in bone weights");
              }
            }
            uVar7 = local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar19 >> 6];
            if ((uVar7 & uVar15) == 0) {
              uVar10 = uVar7 | uVar15;
              if (this->mThreshold <= local_b4) {
                uVar10 = uVar7 & local_60;
              }
              local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p[uVar19 >> 6] = uVar10;
            }
          }
          uVar17 = uVar17 + 1;
          ppaVar8 = pMesh->mBones;
          paVar13 = ppaVar8[uVar19];
        } while (uVar17 < paVar13->mNumWeights);
        uVar6 = pMesh->mNumBones;
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 < uVar6);
  }
  local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start._0_4_ = 0xffffffff;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_b0,(ulong)pMesh->mNumFaces,(value_type_conflict3 *)&local_90,
             (allocator_type *)&local_d8);
  local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)((ulong)local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&local_90,(ulong)pMesh->mNumBones,(value_type_conflict3 *)&local_d8,
             (allocator_type *)&local_e8);
  if (pMesh->mNumFaces != 0) {
    uVar19 = 0;
    iVar12 = 0;
    do {
      paVar16 = pMesh->mFaces;
      uVar6 = *(uint *)(CONCAT71(local_78.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._1_7_,
                                 local_78.
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start._0_1_) +
                       (ulong)*paVar16[uVar19].mIndices * 4);
      uVar9 = paVar16[uVar19].mNumIndices;
      uVar18 = 1;
      if (1 < uVar9) {
        uVar15 = 1;
        do {
          uVar9 = *(uint *)(CONCAT71(local_78.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     local_78.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_1_) +
                           (ulong)paVar16[uVar19].mIndices[uVar15] * 4);
          if (uVar6 == uVar9) {
            uVar18 = uVar18 + 1;
          }
          else {
            uVar14 = pMesh->mNumBones;
            if (uVar6 < uVar14) {
              local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p[uVar6 >> 6] =
                   local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar6 >> 6] |
                   1L << ((byte)uVar6 & 0x3f);
              uVar14 = pMesh->mNumBones;
            }
            if (uVar9 < uVar14) {
              local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
              _M_start.super__Bit_iterator_base._M_p[uVar9 >> 6] =
                   local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                   super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p[uVar9 >> 6] |
                   1L << ((byte)uVar9 & 0x3f);
            }
          }
          uVar15 = uVar15 + 1;
          paVar16 = pMesh->mFaces;
          uVar9 = paVar16[uVar19].mNumIndices;
        } while (uVar15 < uVar9);
      }
      if ((uVar6 < pMesh->mNumBones) && (uVar18 == uVar9)) {
        *(uint *)(CONCAT44(local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start._4_4_,
                           local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_start._0_4_) + uVar19 * 4) = uVar6;
        piVar1 = (int *)(CONCAT44(local_90.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_,
                                  local_90.
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start._0_4_) + (ulong)uVar6 * 4
                        );
        *piVar1 = *piVar1 + 1;
      }
      else {
        iVar12 = iVar12 + 1;
      }
      uVar19 = uVar19 + 1;
      uVar15 = (ulong)pMesh->mNumFaces;
    } while (uVar19 < uVar15);
    if (pMesh->mNumFaces == 0) {
      if (iVar12 == 0) goto LAB_003bf3b6;
      local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (uint *)0x0;
      local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
    }
    else {
      uVar19 = 0;
      do {
        uVar6 = *(uint *)(CONCAT44(local_b0.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start._4_4_,
                                   local_b0.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_start._0_4_) + uVar19 * 4);
        uVar17 = (ulong)uVar6;
        if ((uVar6 < pMesh->mNumBones) &&
           ((local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
             _M_start.super__Bit_iterator_base._M_p[uVar6 >> 6] >> (uVar17 & 0x3f) & 1) != 0)) {
          iVar3 = *(int *)(CONCAT44(local_90.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start._4_4_,
                                    local_90.
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                    _M_impl.super__Vector_impl_data._M_start._0_4_) + uVar17 * 4);
          if (iVar3 == 0) {
            __assert_fail("facesPerBone[faceBones[i]]>0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/wbrbr[P]realtime/external/assimp/code/PostProcessing/DeboneProcess.cpp"
                          ,0x149,
                          "void Assimp::DeboneProcess::SplitMesh(const aiMesh *, std::vector<std::pair<aiMesh *, const aiBone *>> &) const"
                         );
          }
          *(int *)(CONCAT44(local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start._0_4_) + uVar17 * 4) =
               iVar3 + -1;
          iVar12 = iVar12 + 1;
          *(undefined4 *)
           (CONCAT44(local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start._4_4_,
                     local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start._0_4_) + uVar19 * 4) = 0xffffffff;
          uVar15 = (ulong)pMesh->mNumFaces;
        }
        uVar19 = uVar19 + 1;
      } while (uVar19 < uVar15);
      if (iVar12 == 0) goto LAB_003bf3b6;
      local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (uint *)0x0;
      local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
      local_e8.first = (aiMesh *)((ulong)local_e8.first & 0xffffffff00000000);
      if ((int)uVar15 != 0) {
        uVar6 = 0;
        do {
          if (*(int *)(CONCAT44(local_b0.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start._4_4_,
                                local_b0.
                                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                _M_impl.super__Vector_impl_data._M_start._0_4_) + (ulong)uVar6 * 4)
              == -1) {
            if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish ==
                local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_d8,
                         (iterator)
                         local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                         _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_e8);
            }
            else {
              *local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish = uVar6;
              local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish =
                   local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_finish + 1;
            }
          }
          uVar6 = (int)local_e8.first + 1;
          local_e8.first = (aiMesh *)CONCAT44(local_e8.first._4_4_,uVar6);
        } while (uVar6 < pMesh->mNumFaces);
      }
    }
    local_e8.first = MakeSubmesh(pMesh,&local_d8,0);
    local_e8.second = (aiBone *)0x0;
    iVar4._M_current = *(pair<aiMesh_*,_const_aiBone_*> **)(local_98 + 8);
    if (iVar4._M_current == *(pair<aiMesh_*,_const_aiBone_*> **)(local_98 + 0x10)) {
      std::vector<std::pair<aiMesh*,aiBone_const*>,std::allocator<std::pair<aiMesh*,aiBone_const*>>>
      ::_M_realloc_insert<std::pair<aiMesh*,aiBone_const*>const&>(local_98,iVar4,&local_e8);
    }
    else {
      local_e8.first._4_4_ = (undefined4)((ulong)local_e8.first >> 0x20);
      *(int *)&(iVar4._M_current)->first = (int)local_e8.first;
      *(undefined4 *)((long)&(iVar4._M_current)->first + 4) = local_e8.first._4_4_;
      *(undefined4 *)&(iVar4._M_current)->second = 0;
      *(undefined4 *)((long)&(iVar4._M_current)->second + 4) = 0;
      *(long *)(local_98 + 8) = *(long *)(local_98 + 8) + 0x10;
    }
    if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
  }
LAB_003bf3b6:
  uVar6 = pMesh->mNumBones;
  if (uVar6 != 0) {
    uVar19 = 0;
    do {
      if (((local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p[uVar19 >> 6] >> (uVar19 & 0x3f) & 1) == 0) &&
         (*(int *)(CONCAT44(local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start._4_4_,
                            local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                            ._M_impl.super__Vector_impl_data._M_start._0_4_) + uVar19 * 4) != 0)) {
        local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish = (uint *)0x0;
        local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
        local_e8.first = (aiMesh *)((ulong)local_e8.first & 0xffffffff00000000);
        if (pMesh->mNumFaces != 0) {
          uVar6 = 0;
          do {
            if (uVar19 == *(uint *)(CONCAT44(local_b0.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                             local_b0.
                                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                             ._M_impl.super__Vector_impl_data._M_start._0_4_) +
                                   (ulong)uVar6 * 4)) {
              if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>
                          ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_d8,
                           (iterator)
                           local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_e8);
              }
              else {
                *local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish = uVar6;
                local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
              }
            }
            uVar6 = (int)local_e8.first + 1;
            local_e8.first = (aiMesh *)CONCAT44(local_e8.first._4_4_,uVar6);
          } while (uVar6 < pMesh->mNumFaces);
        }
        this_01 = pMesh;
        mesh = MakeSubmesh(pMesh,&local_d8,1);
        ApplyTransform((DeboneProcess *)this_01,mesh,&pMesh->mBones[uVar19]->mOffsetMatrix);
        local_e8.second = pMesh->mBones[uVar19];
        iVar4._M_current = *(pair<aiMesh_*,_const_aiBone_*> **)(local_98 + 8);
        local_e8.first = mesh;
        if (iVar4._M_current == *(pair<aiMesh_*,_const_aiBone_*> **)(local_98 + 0x10)) {
          std::
          vector<std::pair<aiMesh*,aiBone_const*>,std::allocator<std::pair<aiMesh*,aiBone_const*>>>
          ::_M_realloc_insert<std::pair<aiMesh*,aiBone_const*>const&>(local_98,iVar4,&local_e8);
        }
        else {
          local_e8.first._0_4_ = (int)mesh;
          local_e8.first._4_4_ = (undefined4)((ulong)mesh >> 0x20);
          local_e8.second._4_4_ = (undefined4)((ulong)local_e8.second >> 0x20);
          *(int *)&(iVar4._M_current)->first = (int)local_e8.first;
          *(undefined4 *)((long)&(iVar4._M_current)->first + 4) = local_e8.first._4_4_;
          *(undefined4 *)&(iVar4._M_current)->second = local_e8.second._0_4_;
          *(undefined4 *)((long)&(iVar4._M_current)->second + 4) = local_e8.second._4_4_;
          *(long *)(local_98 + 8) = *(long *)(local_98 + 8) + 0x10;
        }
        if (local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_d8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        uVar6 = pMesh->mNumBones;
      }
      uVar19 = uVar19 + 1;
    } while (uVar19 < uVar6);
  }
  if ((void *)CONCAT44(local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                       local_90.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_90.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     local_90.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_4_));
  }
  if ((void *)CONCAT44(local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start._4_4_,
                       local_b0.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start._0_4_) != (void *)0x0) {
    operator_delete((void *)CONCAT44(local_b0.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start._4_4_,
                                     local_b0.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_4_));
  }
  if ((void *)CONCAT71(local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start._1_7_,
                       local_78.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start._0_1_) != (void *)0x0) {
    operator_delete((void *)CONCAT71(local_78.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                     local_78.
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start._0_1_));
  }
  if (local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
      super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_58.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return;
}

Assistant:

void DeboneProcess::SplitMesh( const aiMesh* pMesh, std::vector< std::pair< aiMesh*,const aiBone* > >& poNewMeshes) const
{
    // same deal here as ConsiderMesh basically

    std::vector<bool> isBoneNecessary(pMesh->mNumBones,false);
    std::vector<unsigned int> vertexBones(pMesh->mNumVertices,UINT_MAX);

    const unsigned int cUnowned = UINT_MAX;
    const unsigned int cCoowned = UINT_MAX-1;

    for(unsigned int i=0;i<pMesh->mNumBones;i++)    {
        for(unsigned int j=0;j<pMesh->mBones[i]->mNumWeights;j++)   {
            float w = pMesh->mBones[i]->mWeights[j].mWeight;

            if(w==0.0f) {
                continue;
            }

            unsigned int vid = pMesh->mBones[i]->mWeights[j].mVertexId;

            if(w>=mThreshold) {
                if(vertexBones[vid]!=cUnowned)  {
                    if(vertexBones[vid]==i) //double entry
                    {
                        ASSIMP_LOG_WARN("Encountered double entry in bone weights");
                    }
                    else //TODO: track attraction in order to break tie
                    {
                        vertexBones[vid] = cCoowned;
                    }
                }
                else vertexBones[vid] = i;
            }

            if(!isBoneNecessary[i]) {
                isBoneNecessary[i] = w<mThreshold;
            }
        }
    }

    unsigned int nFacesUnowned = 0;

    std::vector<unsigned int> faceBones(pMesh->mNumFaces,UINT_MAX);
    std::vector<unsigned int> facesPerBone(pMesh->mNumBones,0);

    for(unsigned int i=0;i<pMesh->mNumFaces;i++) {
        unsigned int nInterstitial = 1;

        unsigned int v = vertexBones[pMesh->mFaces[i].mIndices[0]];

        for(unsigned int j=1;j<pMesh->mFaces[i].mNumIndices;j++) {
            unsigned int w = vertexBones[pMesh->mFaces[i].mIndices[j]];

            if(v!=w)    {
                if(v<pMesh->mNumBones) isBoneNecessary[v] = true;
                if(w<pMesh->mNumBones) isBoneNecessary[w] = true;
            }
            else nInterstitial++;
        }

        if(v<pMesh->mNumBones &&nInterstitial==pMesh->mFaces[i].mNumIndices)    {
            faceBones[i] = v; //primitive belongs to bone #v
            facesPerBone[v]++;
        }
        else nFacesUnowned++;
    }

    // invalidate any "cojoined" faces
    for(unsigned int i=0;i<pMesh->mNumFaces;i++) {
        if(faceBones[i]<pMesh->mNumBones&&isBoneNecessary[faceBones[i]])
        {
            ai_assert(facesPerBone[faceBones[i]]>0);
            facesPerBone[faceBones[i]]--;

            nFacesUnowned++;
            faceBones[i] = cUnowned;
        }
    }

    if(nFacesUnowned) {
        std::vector<unsigned int> subFaces;

        for(unsigned int i=0;i<pMesh->mNumFaces;i++)    {
            if(faceBones[i]==cUnowned) {
                subFaces.push_back(i);
            }
        }

        aiMesh *baseMesh = MakeSubmesh(pMesh,subFaces,0);
        std::pair<aiMesh*,const aiBone*> push_pair(baseMesh,(const aiBone*)0);

        poNewMeshes.push_back(push_pair);
    }

    for(unsigned int i=0;i<pMesh->mNumBones;i++) {

        if(!isBoneNecessary[i]&&facesPerBone[i]>0)  {
            std::vector<unsigned int> subFaces;

            for(unsigned int j=0;j<pMesh->mNumFaces;j++)    {
                if(faceBones[j]==i) {
                    subFaces.push_back(j);
                }
            }

            unsigned int f = AI_SUBMESH_FLAGS_SANS_BONES;
            aiMesh *subMesh =MakeSubmesh(pMesh,subFaces,f);

            //Lifted from PretransformVertices.cpp
            ApplyTransform(subMesh,pMesh->mBones[i]->mOffsetMatrix);
            std::pair<aiMesh*,const aiBone*> push_pair(subMesh,pMesh->mBones[i]);

            poNewMeshes.push_back(push_pair);
        }
    }
}